

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgdata.cpp
# Opt level: O0

int runCommand(char *command,UBool specialHandling)

{
  size_t sVar1;
  int result;
  int32_t len;
  char cmdBuffer [512];
  char *cmd;
  UBool specialHandling_local;
  char *command_local;
  
  cmdBuffer[0x1f8] = '\0';
  cmdBuffer[0x1f9] = '\0';
  cmdBuffer[0x1fa] = '\0';
  cmdBuffer[0x1fb] = '\0';
  cmdBuffer[0x1fc] = '\0';
  cmdBuffer[0x1fd] = '\0';
  cmdBuffer[0x1fe] = '\0';
  cmdBuffer[0x1ff] = '\0';
  sVar1 = strlen(command);
  if ((int)sVar1 == 0) {
    command_local._4_4_ = 0;
  }
  else {
    cmdBuffer._504_8_ = command;
    printf("pkgdata: %s\n",command);
    command_local._4_4_ = system((char *)cmdBuffer._504_8_);
    if (command_local._4_4_ != 0) {
      fprintf(_stderr,"-- return status = %d\n",(ulong)command_local._4_4_);
    }
    if (((int *)cmdBuffer._504_8_ != &result) && ((char *)cmdBuffer._504_8_ != command)) {
      uprv_free_63((void *)cmdBuffer._504_8_);
    }
  }
  return command_local._4_4_;
}

Assistant:

static int runCommand(const char* command, UBool specialHandling) {
    char *cmd = NULL;
    char cmdBuffer[SMALL_BUFFER_MAX_SIZE];
    int32_t len = static_cast<int32_t>(strlen(command));

    if (len == 0) {
        return 0;
    }

    if (!specialHandling) {
#if defined(USING_CYGWIN) || U_PLATFORM == U_PF_MINGW || U_PLATFORM == U_PF_OS400
        if ((len + BUFFER_PADDING_SIZE) >= SMALL_BUFFER_MAX_SIZE) {
            cmd = (char *)uprv_malloc(len + BUFFER_PADDING_SIZE);
        } else {
            cmd = cmdBuffer;
        }
#if defined(USING_CYGWIN) || U_PLATFORM == U_PF_MINGW
        sprintf(cmd, "bash -c \"%s\"", command);

#elif U_PLATFORM == U_PF_OS400
        sprintf(cmd, "QSH CMD('%s')", command);
#endif
#else
        goto normal_command_mode;
#endif
    } else {
#if !(defined(USING_CYGWIN) || U_PLATFORM == U_PF_MINGW || U_PLATFORM == U_PF_OS400)
normal_command_mode:
#endif
        cmd = (char *)command;
    }

    printf("pkgdata: %s\n", cmd);
    int result = system(cmd);
    if (result != 0) {
        fprintf(stderr, "-- return status = %d\n", result);
    }

    if (cmd != cmdBuffer && cmd != command) {
        uprv_free(cmd);
    }

    return result;
}